

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O1

int decode(jpeg *j,huffman *h)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  if (j->code_bits < 0x10) {
    grow_buffer_unsafe(j);
  }
  uVar1 = j->code_buffer;
  iVar2 = j->code_bits;
  uVar4 = (ulong)h->fast[uVar1 >> ((char)iVar2 - 9U & 0x1f) & 0x1ff];
  if (uVar4 == 0xff) {
    uVar3 = uVar1 >> ((byte)(iVar2 + -0x10) & 0x1f);
    if (iVar2 < 0x10) {
      uVar3 = uVar1 << (0x10U - (char)iVar2 & 0x1f);
    }
    lVar6 = 0;
    do {
      lVar5 = lVar6;
      lVar6 = lVar5 + 1;
    } while (h->maxcode[lVar5 + 10] <= (uVar3 & 0xffff));
    if (lVar6 == 8) {
      j->code_bits = iVar2 + -0x10;
      uVar3 = 0xffffffff;
    }
    else {
      uVar3 = 0xffffffff;
      if ((int)lVar5 + 10 <= iVar2) {
        lVar6 = (ulong)(iVar2 - 9) - lVar6;
        uVar3 = bmask[lVar5 + 10];
        iVar2 = h->delta[lVar5 + 10];
        j->code_bits = (int)lVar6;
        uVar3 = (uint)h->values[(int)((uVar1 >> ((byte)lVar6 & 0x1f) & uVar3) + iVar2)];
      }
    }
  }
  else {
    uVar3 = 0xffffffff;
    if ((int)(uint)h->size[uVar4] <= iVar2) {
      j->code_bits = iVar2 - (uint)h->size[uVar4];
      uVar3 = (uint)h->values[uVar4];
    }
  }
  return uVar3;
}

Assistant:

__forceinline static int decode(jpeg *j, huffman *h)
{
   unsigned int temp;
   int c,k;

   if (j->code_bits < 16) grow_buffer_unsafe(j);

   // look at the top FAST_BITS and determine what symbol ID it is,
   // if the code is <= FAST_BITS
   c = (j->code_buffer >> (j->code_bits - FAST_BITS)) & ((1 << FAST_BITS)-1);
   k = h->fast[c];
   if (k < 255) {
      if (h->size[k] > j->code_bits)
         return -1;
      j->code_bits -= h->size[k];
      return h->values[k];
   }

   // naive test is to shift the code_buffer down so k bits are
   // valid, then test against maxcode. To speed this up, we've
   // preshifted maxcode left so that it has (16-k) 0s at the
   // end; in other words, regardless of the number of bits, it
   // wants to be compared against something shifted to have 16;
   // that way we don't need to shift inside the loop.
   if (j->code_bits < 16)
      temp = (j->code_buffer << (16 - j->code_bits)) & 0xffff;
   else
      temp = (j->code_buffer >> (j->code_bits - 16)) & 0xffff;
   for (k=FAST_BITS+1 ; ; ++k)
      if (temp < h->maxcode[k])
         break;
   if (k == 17) {
      // error! code not found
      j->code_bits -= 16;
      return -1;
   }

   if (k > j->code_bits)
      return -1;

   // convert the huffman code to the symbol id
   c = ((j->code_buffer >> (j->code_bits - k)) & bmask[k]) + h->delta[k];
   assert((((j->code_buffer) >> (j->code_bits - h->size[c])) & bmask[h->size[c]]) == h->code[c]);

   // convert the id to a symbol
   j->code_bits -= k;
   return h->values[c];
}